

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::ValueExtractor::extractOutline
          (ValueExtractor *this,int *borders,QBrush *colors,BorderStyle *styles,QSize *radii,
          int *offsets)

{
  Property PVar1;
  int iVar2;
  BorderStyle BVar3;
  bool bVar4;
  QBrush *pQVar5;
  QSize QVar6;
  int *m;
  long lVar7;
  Declaration *pDVar8;
  int i;
  ulong uVar9;
  
  extractFont(this);
  lVar7 = 0;
  uVar9 = 0;
  bVar4 = false;
  do {
    if ((ulong)(this->declarations).d.size <= uVar9) {
      return bVar4;
    }
    pDVar8 = (this->declarations).d.ptr;
    PVar1 = (pDVar8[uVar9].d.d.ptr)->propertyId;
    if (9 < PVar1 - Outline) goto LAB_00540232;
    pDVar8 = (Declaration *)((long)&(pDVar8->d).d.ptr + lVar7);
    switch(PVar1) {
    case Outline:
      borderValue(this,pDVar8,borders + 3,styles + 3,colors + 3);
      iVar2 = borders[3];
      borders[2] = iVar2;
      borders[1] = iVar2;
      *borders = iVar2;
      BVar3 = styles[3];
      styles[2] = BVar3;
      styles[1] = BVar3;
      *styles = BVar3;
      pQVar5 = QBrush::operator=(colors + 2,colors + 3);
      pQVar5 = QBrush::operator=(colors + 1,pQVar5);
      QBrush::operator=(colors,pQVar5);
      break;
    case OutlineOffset:
      m = offsets;
      goto LAB_005401f7;
    case OutlineWidth:
      m = borders;
LAB_005401f7:
      lengthValues(this,pDVar8,m);
      break;
    case OutlineColor:
      Declaration::brushValues(pDVar8,colors,&this->pal);
      break;
    case OutlineStyle:
      Declaration::styleValues(pDVar8,styles);
      break;
    case OutlineRadius:
      sizeValues(this,pDVar8,radii);
      break;
    case OutlineTopLeftRadius:
      QVar6 = sizeValue(this,pDVar8);
      *radii = QVar6;
      break;
    case OutlineTopRightRadius:
      QVar6 = sizeValue(this,pDVar8);
      radii[1] = QVar6;
      break;
    case OutlineBottomLeftRadius:
      QVar6 = sizeValue(this,pDVar8);
      radii[2] = QVar6;
      break;
    case OutlineBottomRightRadius:
      QVar6 = sizeValue(this,pDVar8);
      radii[3] = QVar6;
    }
    bVar4 = true;
LAB_00540232:
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 8;
  } while( true );
}

Assistant:

bool ValueExtractor::extractOutline(int *borders, QBrush *colors, BorderStyle *styles,
                                   QSize *radii, int *offsets)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case OutlineWidth: lengthValues(decl, borders); break;
        case OutlineColor: decl.brushValues(colors, pal); break;
        case OutlineStyle:  decl.styleValues(styles); break;

        case OutlineTopLeftRadius: radii[0] = sizeValue(decl); break;
        case OutlineTopRightRadius: radii[1] = sizeValue(decl); break;
        case OutlineBottomLeftRadius: radii[2] = sizeValue(decl); break;
        case OutlineBottomRightRadius: radii[3] = sizeValue(decl); break;
        case OutlineRadius: sizeValues(decl, radii); break;
        case OutlineOffset: lengthValues(decl, offsets); break;

        case Outline:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            borders[TopEdge] = borders[RightEdge] = borders[BottomEdge] = borders[LeftEdge];
            styles[TopEdge] = styles[RightEdge] = styles[BottomEdge] = styles[LeftEdge];
            colors[TopEdge] = colors[RightEdge] = colors[BottomEdge] = colors[LeftEdge];
            break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}